

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

void __thiscall
AbstractModuleClient::sendPlaybackCommand(AbstractModuleClient *this,string *cmd,uint32_t time)

{
  TrodesMsg msg;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  TrodesMsg local_40;
  
  std::__cxx11::string::string((string *)&local_60,"ss4",&local_a1);
  std::__cxx11::string::string((string *)&local_80,(string *)cmd);
  TrodesMsg::TrodesMsg<char_const*,std::__cxx11::string,unsigned_int>
            (&local_40,&local_60,"_Acq",&local_80,time);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_a0,"cmd",&local_a1);
  sendMsgToTrodes(this,&local_a0,&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  TrodesMsg::~TrodesMsg(&local_40);
  return;
}

Assistant:

void AbstractModuleClient::sendPlaybackCommand(std::string cmd, uint32_t time) {
    TrodesMsg msg("ss4", acquisition_CMD, cmd, time);
    sendMsgToTrodes(TRODES_CMD, msg); //tell trodes to relay the command
}